

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessQueriesTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::Queries::ErrorsTest::testNegativeNumberOfObjects(ErrorsTest *this)

{
  ostringstream *stream;
  ostringstream *this_00;
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  MessageBuilder *pMVar4;
  undefined1 *value;
  GLenum *pGVar5;
  ulong uVar6;
  GLuint query;
  ErrorsTest *local_1c8;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [384];
  long lVar3;
  
  local_1c8 = this;
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  value = s_target_names;
  pGVar5 = s_targets;
  uVar6 = 0;
  do {
    if (uVar6 == 7) {
LAB_00b0b61e:
      return 6 < uVar6;
    }
    query = 0;
    (**(code **)(lVar3 + 0x3d8))(*pGVar5,0xffffffffffffffff,&query);
    iVar1 = (**(code **)(lVar3 + 0x800))();
    if (iVar1 != 0x501) {
      local_1b0._0_8_ = ((local_1c8->super_TestCase).m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::operator<<((ostream *)(local_1b0 + 8),"glCreateQueries called with target ");
      pMVar4 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,(char **)value);
      stream = &pMVar4->m_str;
      std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                      " with negative number of objects to be created (-1) has generated error ");
      local_1c0.m_getName = glu::getErrorName;
      local_1c0.m_value = iVar1;
      tcu::Format::Enum<int,_2UL>::toStream
                (&local_1c0,&stream->super_basic_ostream<char,_std::char_traits<char>_>);
      std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                      ", however GL_INVALID_VALUE was expected.");
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
      if (query != 0) {
        (**(code **)(lVar3 + 0x458))(1,&query);
        do {
          iVar2 = (**(code **)(lVar3 + 0x800))();
        } while (iVar1 == iVar2);
        local_1b0._0_8_ = ((local_1c8->super_TestCase).m_context)->m_testCtx->m_log;
        this_00 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::operator<<((ostream *)this_00,"glCreateQueries called with target ");
        pMVar4 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,(char **)value);
        std::operator<<(&(pMVar4->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                        " with negative number of objects to be created (-1) has created at least one object."
                       );
        tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
      }
      goto LAB_00b0b61e;
    }
    uVar6 = uVar6 + 1;
    value = (undefined1 *)((long)value + 8);
    pGVar5 = pGVar5 + 1;
  } while( true );
}

Assistant:

bool ErrorsTest::testNegativeNumberOfObjects()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Test for each target. */
	for (glw::GLuint i = 0; i < s_targets_count; ++i)
	{
		glw::GLuint query = 0;

		gl.createQueries(s_targets[i], -1, &query); /* Create negative number of queries. */

		glw::GLenum error = gl.getError();

		if (GL_INVALID_VALUE != error)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "glCreateQueries called with target " << s_target_names[i]
				<< " with negative number of objects to be created (-1) has generated error " << glu::getErrorStr(error)
				<< ", however GL_INVALID_VALUE was expected." << tcu::TestLog::EndMessage;

			if (query)
			{
				gl.deleteQueries(1, &query);

				while (error == gl.getError())
					;

				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "glCreateQueries called with target " << s_target_names[i]
					<< " with negative number of objects to be created (-1) has created at least one object."
					<< tcu::TestLog::EndMessage;
			}

			return false;
		}
	}

	return true;
}